

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

void Gia_ManPatSatImprove(Gia_Man_t *p,int nWords0,int fVerbose)

{
  int iVar1;
  char cVar2;
  int iVar3;
  Vec_Wrd_t *vSims_00;
  Vec_Int_t *vCexStore_00;
  Vec_Wrd_t *vSims;
  Vec_Int_t *vCexStore;
  Vec_Str_t *vStatus;
  Vec_Wrd_t *vSimsIn;
  Gia_Man_t *pGia;
  uint local_28;
  int Counts [3];
  int Status;
  int i;
  int fVerbose_local;
  int nWords0_local;
  Gia_Man_t *p_local;
  
  memset((void *)((long)&pGia + 4),0,0xc);
  vStatus = (Vec_Str_t *)0x0;
  vCexStore = (Vec_Int_t *)0x0;
  vSims_00 = Gia_ManSimPatSim(p);
  vSimsIn = (Vec_Wrd_t *)Gia_ManSimPatGenMiter(p,vSims_00);
  vCexStore_00 = Cbs2_ManSolveMiterNc((Gia_Man_t *)vSimsIn,1000,(Vec_Str_t **)&vCexStore,0);
  Gia_ManStop((Gia_Man_t *)vSimsIn);
  Counts[2] = 0;
  while( true ) {
    iVar1 = Counts[2];
    iVar3 = Vec_StrSize((Vec_Str_t *)vCexStore);
    if (iVar3 <= iVar1) {
      if (fVerbose != 0) {
        printf("Total = %d : SAT = %d.  UNSAT = %d.  UNDEC = %d.\n",
               (ulong)(local_28 + Counts[0] + pGia._4_4_),(ulong)local_28,(ulong)(uint)Counts[0],
               (ulong)pGia._4_4_);
      }
      if (local_28 == 0) {
        printf("There are no counter-examples.  No need for more simulation.\n");
      }
      else {
        vStatus = (Vec_Str_t *)Gia_ManSimBitPacking(p,vCexStore_00,local_28,pGia._4_4_);
        Vec_WrdFreeP(&p->vSimsPi);
        p->vSimsPi = (Vec_Wrd_t *)vStatus;
      }
      Vec_StrFree((Vec_Str_t *)vCexStore);
      Vec_IntFree(vCexStore_00);
      Vec_WrdFree(vSims_00);
      return;
    }
    cVar2 = Vec_StrEntry((Vec_Str_t *)vCexStore,Counts[2]);
    Counts[1] = (int)cVar2;
    if ((Counts[1] < -1) || (1 < Counts[1])) break;
    *(int *)((long)&pGia + (long)(Counts[1] + 1) * 4 + 4) =
         *(int *)((long)&pGia + (long)(Counts[1] + 1) * 4 + 4) + 1;
    Counts[2] = Counts[2] + 1;
  }
  __assert_fail("Status >= -1 && Status <= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                ,0x1ad,"void Gia_ManPatSatImprove(Gia_Man_t *, int, int)");
}

Assistant:

void Gia_ManPatSatImprove( Gia_Man_t * p, int nWords0, int fVerbose )
{
    extern Vec_Int_t * Cbs2_ManSolveMiterNc( Gia_Man_t * pAig, int nConfs, Vec_Str_t ** pvStatus, int fVerbose );
    int i, Status, Counts[3] = {0};
    Gia_Man_t * pGia;
    Vec_Wrd_t * vSimsIn = NULL;
    Vec_Str_t * vStatus = NULL;
    Vec_Int_t * vCexStore = NULL;
    Vec_Wrd_t * vSims = Gia_ManSimPatSim( p );
    //Gia_ManSimProfile( p );
    pGia  = Gia_ManSimPatGenMiter( p, vSims );
    vCexStore = Cbs2_ManSolveMiterNc( pGia, 1000, &vStatus, 0 );
    Gia_ManStop( pGia );
    Vec_StrForEachEntry( vStatus, Status, i )
    {
        assert( Status >= -1 && Status <= 1 );
        Counts[Status+1]++;
    }
    if ( fVerbose )
        printf( "Total = %d : SAT = %d.  UNSAT = %d.  UNDEC = %d.\n", Counts[1]+Counts[2]+Counts[0], Counts[1], Counts[2], Counts[0] );
    if ( Counts[1] == 0 )
        printf( "There are no counter-examples.  No need for more simulation.\n" );
    else
    {
        vSimsIn = Gia_ManSimBitPacking( p, vCexStore, Counts[1], Counts[0] );
        Vec_WrdFreeP( &p->vSimsPi );
        p->vSimsPi = vSimsIn;
        //Gia_ManSimProfile( p );
    }
    Vec_StrFree( vStatus );
    Vec_IntFree( vCexStore );
    Vec_WrdFree( vSims );
}